

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O2

bool __thiscall VBW::ConvexCell::cell_has_conflict(ConvexCell *this,vec4 *P)

{
  bool bVar1;
  ushort uVar2;
  
  for (uVar2 = (ushort)this->first_valid_; uVar2 != 0x3fff;
      uVar2 = (this->t_).
              super_vector<VBW::TriangleWithFlags,_GEO::Memory::aligned_allocator<VBW::TriangleWithFlags,_64>_>
              .
              super__Vector_base<VBW::TriangleWithFlags,_GEO::Memory::aligned_allocator<VBW::TriangleWithFlags,_64>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar2].flags) {
    bVar1 = triangle_is_in_conflict
                      (this,(this->t_).
                            super_vector<VBW::TriangleWithFlags,_GEO::Memory::aligned_allocator<VBW::TriangleWithFlags,_64>_>
                            .
                            super__Vector_base<VBW::TriangleWithFlags,_GEO::Memory::aligned_allocator<VBW::TriangleWithFlags,_64>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar2],P);
    if (bVar1) break;
  }
  return uVar2 != 0x3fff;
}

Assistant:

bool cell_has_conflict(const vec4& P) {
	for(
	    ushort t = first_triangle();
	    t!=END_OF_LIST; t=next_triangle(t)
	) {
	    TriangleWithFlags T = get_triangle_and_flags(t);
	    if(triangle_is_in_conflict(T,P)) {
		return true;
	    }
	}
	return false;
    }